

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTool.hpp
# Opt level: O1

void __thiscall
helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this,string *content,
          string *unit)

{
  pointer pcVar1;
  rep rVar2;
  
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_t_).__d.__r = rVar2;
  (this->m_unit_)._M_dataplus._M_p = (pointer)&(this->m_unit_).field_2;
  pcVar1 = (unit->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_unit_,pcVar1,pcVar1 + unit->_M_string_length);
  (this->content_)._M_dataplus._M_p = (pointer)&(this->content_).field_2;
  pcVar1 = (content->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->content_,pcVar1,pcVar1 + content->_M_string_length);
  this->times_ = 1;
  return;
}

Assistant:

Timer(const std::string& content = "program",
        const std::string& unit="micro seconds"):
        m_t_(std::chrono::high_resolution_clock::now()),
        content_(content),
        m_unit_(unit),
        times_(1)   // 次数默认为1
    {

    }